

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O1

void __thiscall
TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>::TPZDohrPrecondV2SubData
          (TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *this,int subindex,
          TPZAutoPointer<TPZDohrSubstructCondense<double>_> *substruct,
          TPZAutoPointer<TPZFMatrix<double>_> *res_local)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  TPZReference *pTVar3;
  TPZReference *pTVar4;
  TPZDohrAssembleItem<double> *this_00;
  
  pTVar2 = substruct->fRef;
  (this->fSubStructure).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  pTVar3 = res_local->fRef;
  (this->fInput_local).fRef = pTVar3;
  LOCK();
  paVar1 = &pTVar3->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  pTVar4 = (TPZReference *)operator_new(0x10);
  pTVar4->fPointer = (TPZDohrAssembleItem<double> *)0x0;
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar4->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fv2_local).fRef = pTVar4;
  this_00 = (TPZDohrAssembleItem<double> *)operator_new(0x98);
  TPZDohrAssembleItem<double>::TPZDohrAssembleItem
            (this_00,subindex,
             (int)(res_local->fRef->fPointer->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
  TPZAutoPointer<TPZDohrAssembleItem<double>_>::operator=(&this->fv2_local,this_00);
  return;
}

Assistant:

TPZDohrPrecondV2SubData(int subindex, const TPZAutoPointer<TSubStruct> &substruct, TPZAutoPointer<TPZFMatrix<TVar> > res_local) : fSubStructure(substruct),
	fInput_local(res_local)
	{
		fv2_local = new TPZDohrAssembleItem<TVar>(subindex, res_local->Rows());
	}